

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter.c
# Opt level: O2

void aom_lpf_vertical_6_c(uint8_t *s,int pitch,uint8_t *blimit,uint8_t *limit,uint8_t *thresh)

{
  uint8_t p2;
  uint8_t p1;
  uint8_t p0;
  uint8_t q0;
  uint8_t q1;
  uint8_t q2;
  int8_t mask;
  int8_t flat;
  int iVar1;
  bool bVar2;
  uint8_t in_stack_ffffffffffffff78;
  
  iVar1 = 4;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    p2 = s[-3];
    p1 = s[-2];
    p0 = s[-1];
    q0 = *s;
    q1 = s[1];
    q2 = s[2];
    mask = filter_mask3_chroma(*limit,*blimit,p2,p1,p0,q0,q1,q2);
    flat = flat_mask3_chroma(p2,p1,p0,q0,q1,q2,in_stack_ffffffffffffff78);
    filter6(mask,*thresh,flat,s + -3,s + -2,s + -1,s,s + 1,s + 2);
    s = s + pitch;
  }
  return;
}

Assistant:

void aom_lpf_vertical_6_c(uint8_t *s, int pitch, const uint8_t *blimit,
                          const uint8_t *limit, const uint8_t *thresh) {
  int i;
  int count = 4;

  for (i = 0; i < count; ++i) {
    const uint8_t p2 = s[-3], p1 = s[-2], p0 = s[-1];
    const uint8_t q0 = s[0], q1 = s[1], q2 = s[2];
    const int8_t mask =
        filter_mask3_chroma(*limit, *blimit, p2, p1, p0, q0, q1, q2);
    const int8_t flat = flat_mask3_chroma(1, p2, p1, p0, q0, q1, q2);
    filter6(mask, *thresh, flat, s - 3, s - 2, s - 1, s, s + 1, s + 2);
    s += pitch;
  }
}